

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VtabCallCreate(sqlite3 *db,int iDb,char *zTab,char **pzErr)

{
  Module *pMod;
  _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *xConstruct;
  int iVar1;
  Table *pTab;
  HashElem *pHVar2;
  char *pcVar3;
  VTable *pVVar4;
  VTable **ppVVar5;
  
  pTab = sqlite3FindTable(db,zTab,db->aDb[iDb].zDbSName);
  pcVar3 = *pTab->azModuleArg;
  pHVar2 = findElementWithHash(&db->aModule,pcVar3,(uint *)0x0);
  pMod = (Module *)pHVar2->data;
  if (pMod != (Module *)0x0) {
    xConstruct = pMod->pModule->xCreate;
    if ((xConstruct !=
         (_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *)0x0)
       && (pMod->pModule->xDestroy != (_func_int_sqlite3_vtab_ptr *)0x0)) {
      iVar1 = vtabCallConstructor(db,pTab,pMod,xConstruct,pzErr);
      if (iVar1 != 0) {
        return iVar1;
      }
      pVVar4 = pTab->pVTable;
      if (pVVar4 == (VTable *)0x0) {
        return 0;
      }
      ppVVar5 = &pTab->pVTable;
      do {
        if (pVVar4->db == db) {
          iVar1 = growVTrans(db);
          if (iVar1 != 0) {
            return iVar1;
          }
          do {
            pVVar4 = *ppVVar5;
            ppVVar5 = &pVVar4->pNext;
          } while (pVVar4->db != db);
          iVar1 = db->nVTrans;
          db->nVTrans = iVar1 + 1;
          db->aVTrans[iVar1] = pVVar4;
          pVVar4->nRef = pVVar4->nRef + 1;
          return 0;
        }
        pVVar4 = pVVar4->pNext;
      } while (pVVar4 != (VTable *)0x0);
      return 0;
    }
  }
  pcVar3 = sqlite3MPrintf(db,"no such module: %s",pcVar3);
  *pzErr = pcVar3;
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabCallCreate(sqlite3 *db, int iDb, const char *zTab, char **pzErr){
  int rc = SQLITE_OK;
  Table *pTab;
  Module *pMod;
  const char *zMod;

  pTab = sqlite3FindTable(db, zTab, db->aDb[iDb].zDbSName);
  assert( pTab && IsVirtual(pTab) && !pTab->pVTable );

  /* Locate the required virtual table module */
  zMod = pTab->azModuleArg[0];
  pMod = (Module*)sqlite3HashFind(&db->aModule, zMod);

  /* If the module has been registered and includes a Create method, 
  ** invoke it now. If the module has not been registered, return an 
  ** error. Otherwise, do nothing.
  */
  if( pMod==0 || pMod->pModule->xCreate==0 || pMod->pModule->xDestroy==0 ){
    *pzErr = sqlite3MPrintf(db, "no such module: %s", zMod);
    rc = SQLITE_ERROR;
  }else{
    rc = vtabCallConstructor(db, pTab, pMod, pMod->pModule->xCreate, pzErr);
  }

  /* Justification of ALWAYS():  The xConstructor method is required to
  ** create a valid sqlite3_vtab if it returns SQLITE_OK. */
  if( rc==SQLITE_OK && ALWAYS(sqlite3GetVTable(db, pTab)) ){
    rc = growVTrans(db);
    if( rc==SQLITE_OK ){
      addToVTrans(db, sqlite3GetVTable(db, pTab));
    }
  }

  return rc;
}